

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_gej pj;
  secp256k1_gej local_c8;
  
  secp256k1_scalar_set_b32(seckey_scalar,seckey,(int *)&local_c8);
  bVar3 = ((seckey_scalar->d[3] != 0 || seckey_scalar->d[1] != 0) ||
          (seckey_scalar->d[2] != 0 || seckey_scalar->d[0] != 0)) && (int)local_c8.x.n[0] == 0;
  uVar2 = bVar3 ^ 1;
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[2] = 0x20;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  uVar1 = (long)(int)uVar2 - 1;
  seckey_scalar->d[0] = (ulong)uVar2 | seckey_scalar->d[0] & uVar1;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = (int)(uVar1 >> 0x20);
  *(undefined1 (*) [16])(seckey_scalar->d + 1) =
       auVar4 & *(undefined1 (*) [16])(seckey_scalar->d + 1);
  seckey_scalar->d[3] = seckey_scalar->d[3] & uVar1;
  local_c8.x.n[1] = (uint64_t)seckey_scalar;
  secp256k1_ecmult_gen(ecmult_gen_ctx,&local_c8,seckey_scalar);
  secp256k1_ge_set_gej(p,&local_c8);
  return (uint)bVar3;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}